

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  key_type kVar3;
  size_type expected_max_items;
  hasher *hf;
  char *pcVar4;
  long in_RDI;
  hasher hVar5;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  undefined4 in_stack_fffffffffffff588;
  int in_stack_fffffffffffff58c;
  value_type in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  undefined4 in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff5a0;
  char *in_stack_fffffffffffff5a8;
  int iVar6;
  undefined4 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  key_equal *in_stack_fffffffffffff5b8;
  hasher *in_stack_fffffffffffff5c0;
  size_type in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  undefined4 in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff60c;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff610;
  int local_7f8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_7f0;
  Hasher local_7e0;
  Hasher local_7d4 [16];
  value_type local_714;
  int local_710;
  key_type local_70c;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_708;
  Hasher local_6f8;
  Hasher local_6ec [14];
  key_type local_644;
  char *local_640;
  undefined4 local_634;
  AssertionResult local_630 [2];
  key_type local_60c;
  hasher *local_608;
  undefined4 local_5fc;
  AssertionResult local_5f8 [2];
  size_type local_5d8;
  undefined4 local_5cc;
  AssertionResult local_5c8 [2];
  size_type local_5a8;
  undefined4 local_59c;
  AssertionResult local_598 [2];
  hasher local_578;
  hasher local_568;
  int local_558;
  undefined4 local_554;
  AssertionResult local_550 [2];
  hasher local_530;
  hasher local_520;
  int local_510;
  undefined4 local_50c;
  AssertionResult local_508 [2];
  key_type local_4e8;
  key_type local_4e4;
  AssertionResult local_4e0 [2];
  key_type local_4c0;
  key_type local_4bc;
  AssertionResult local_4b8 [2];
  key_type local_494;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_45c;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  key_type local_424;
  size_type local_420;
  undefined4 local_414;
  AssertionResult local_410 [2];
  key_type local_3ec;
  size_type local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  key_type local_3b4;
  size_type local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0 [2];
  key_type local_37c;
  size_type local_378;
  undefined4 local_36c;
  AssertionResult local_368 [2];
  size_type local_348;
  undefined4 local_33c;
  AssertionResult local_338 [2];
  size_type local_318;
  undefined4 local_30c;
  AssertionResult local_308 [2];
  undefined4 local_2e4;
  size_type local_2e0;
  AssertionResult local_2d8 [2];
  size_type local_2b8;
  AssertionResult local_2b0 [2];
  key_equal local_290;
  key_equal local_280;
  int local_270;
  undefined4 local_26c;
  AssertionResult local_268 [2];
  key_equal local_248;
  key_equal local_238;
  int local_228;
  undefined4 local_224;
  AssertionResult local_220 [2];
  hasher local_200;
  hasher local_1f0;
  int local_1e0;
  undefined4 local_1dc;
  AssertionResult local_1d8 [2];
  hasher local_1b8;
  hasher local_1a8;
  int local_198;
  undefined4 local_194;
  AssertionResult local_190 [2];
  key_type local_170;
  key_type local_16c;
  AssertionResult local_168 [2];
  key_type local_148;
  key_type local_144;
  AssertionResult local_140;
  size_type local_130;
  value_type local_100;
  key_type local_fc;
  value_type local_cc;
  int local_c8;
  key_type local_c4;
  key_type local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0 [9];
  Hasher local_14;
  
  Hasher::Hasher(&local_14,1);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b0);
  local_c0 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                         in_stack_fffffffffffff58c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                    (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  local_c4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                         in_stack_fffffffffffff58c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                    (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  for (local_c8 = 3; local_c8 < 2000; local_c8 = local_c8 + 1) {
    local_cc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                              in_stack_fffffffffffff58c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff610,
             (value_type *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  }
  local_fc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                         in_stack_fffffffffffff58c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
          (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  local_100 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                             in_stack_fffffffffffff58c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff610,
           (value_type *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  local_130 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbc7dfa);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
         (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  local_144 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_148 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc7e57);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc7ecf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc7f32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc7fa3);
  local_16c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_170 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc7fd9);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc8063);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc80c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc8137);
  local_194 = 1;
  local_1b8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff5a0);
  local_1a8 = local_1b8;
  local_198 = Hasher::id(&local_1a8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc8227);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc828a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc82fb);
  local_1dc = 0;
  local_200 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff5a0);
  local_1f0 = local_200;
  local_1e0 = Hasher::id(&local_1f0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc83e7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc844a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc84bb);
  local_224 = 1;
  local_248 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_fffffffffffff5a0);
  local_238 = local_248;
  local_228 = Hasher::id(&local_238);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc85ab);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc860e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc867f);
  local_26c = 0;
  local_290 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_fffffffffffff5a0);
  local_280 = local_290;
  local_270 = Hasher::id(&local_280);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc876b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc87ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc883c);
  local_2b8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbc884d);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc88c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc892b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc8999);
  local_2e0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbc89a6);
  local_2e4 = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (uint *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc8a2c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc8a8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc8afd);
  local_30c = 1;
  local_318 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc8b19);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc8b94);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc8bf7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc8c65);
  local_33c = 0x7cc;
  local_348 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc8c7d);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc8cf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc8d5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc8dcc);
  local_36c = 0;
  local_37c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_378 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc8eb1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc8f14);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc8f85);
  local_3a4 = 1;
  local_3b4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_3b0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc905b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc90be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc912f);
  local_3dc = 1;
  local_3ec = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_3e8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9214);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9277);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc92e8);
  local_414 = 0;
  local_424 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_420 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc93be);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9421);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc9492);
  local_44c = 0;
  local_45c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_458 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9577);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc95da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc964b);
  local_484 = 0;
  local_494 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_490 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9721);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9784);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc97f5);
  google::
  swap<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
             (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  local_4bc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_4c0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc984a);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc98d4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9937);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc99a8);
  local_4e4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  local_4e8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc99de);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff610,
               (Message *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9acb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc9b3c);
  local_50c = 0;
  hVar5 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct(in_stack_fffffffffffff5a0);
  local_530 = hVar5;
  local_520 = hVar5;
  local_510 = Hasher::id(&local_520);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9c2c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              (hVar5._0_8_,(Message *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9c89);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc9cfa);
  local_554 = 1;
  local_578 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff5a0);
  local_568 = local_578;
  local_558 = Hasher::id(&local_568);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (int *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (int *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9dda);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              (hVar5._0_8_,(Message *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9e37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc9ea5);
  local_59c = 0x7cc;
  local_5a8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc9ec1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc9f3c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              (hVar5._0_8_,(Message *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbc9f99);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbca007);
  local_5cc = 1;
  local_5d8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbca01f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff5c0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbca09a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff5c0,
               (Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),(char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              (hVar5._0_8_,(Message *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbca0f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbca168);
  local_5fc = 1;
  expected_max_items = in_RDI + 0x10;
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      in_stack_fffffffffffff58c);
  local_60c = kVar2;
  hf = (hasher *)
       google::
       BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
               (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  local_608 = hf;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  iVar6 = (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f8);
  if (!bVar1) {
    testing::Message::Message((Message *)hf);
    in_stack_fffffffffffff5b8 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xbca23b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hf,(Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),iVar6,
               (char *)in_stack_fffffffffffff5a0);
    testing::internal::AssertHelper::operator=
              (hVar5._0_8_,(Message *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbca298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbca309);
  local_634 = 0;
  kVar3 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      in_stack_fffffffffffff58c);
  local_644 = kVar3;
  pcVar4 = (char *)google::
                   BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                           (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
                          );
  local_640 = pcVar4;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (pcVar4,(char *)in_stack_fffffffffffff5a0,
             (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  iVar6 = (int)((ulong)pcVar4 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (!bVar1) {
    testing::Message::Message((Message *)hf);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0xbca3d3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hf,(Type)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (char *)CONCAT44(kVar3,in_stack_fffffffffffff5b0),iVar6,pcVar4);
    testing::internal::AssertHelper::operator=
              (hVar5._0_8_,(Message *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    testing::Message::~Message((Message *)0xbca430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbca4a1);
  Hasher::Hasher(local_6ec,0);
  Hasher::Hasher(&local_6f8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_708,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(kVar2,in_stack_fffffffffffff5d0),expected_max_items,hf,
             in_stack_fffffffffffff5b8,(allocator_type *)CONCAT44(kVar3,in_stack_fffffffffffff5b0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_708);
  local_70c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          in_stack_fffffffffffff58c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                    (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  for (local_710 = 2; local_710 < 10000; local_710 = local_710 + 1) {
    local_714 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                               in_stack_fffffffffffff58c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(hVar5._0_8_,(value_type *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
  }
  Hasher::Hasher(local_7d4,0);
  Hasher::Hasher(&local_7e0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_7f0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(kVar2,in_stack_fffffffffffff5d0),expected_max_items,hf,
             in_stack_fffffffffffff5b8,(allocator_type *)CONCAT44(kVar3,in_stack_fffffffffffff5b0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_7f0);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
         (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      in_stack_fffffffffffff58c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(kVar2,in_stack_fffffffffffff590),
                    (key_type *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  for (local_7f8 = 2; local_7f8 < 10000; local_7f8 = local_7f8 + 1) {
    in_stack_fffffffffffff590 =
         HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(kVar2,in_stack_fffffffffffff590),in_stack_fffffffffffff58c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(hVar5._0_8_,(value_type *)CONCAT44(hVar5.num_compares_,in_stack_fffffffffffff608));
  }
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbca794);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbca7a1);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbca7ae);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}